

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_FieldsPopulatedCorrectly_Test::TestBody
          (TextFormatTest_FieldsPopulatedCorrectly_Test *this)

{
  UnorderedElementsAreMatcher<std::tuple<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  matcher;
  UnorderedElementsAreMatcher<std::tuple<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  matcher_00;
  UnorderedElementsAreMatcher<std::tuple<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  matcher_01;
  UnorderedElementsAreMatcher<std::tuple<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  matcher_02;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  TestAllTypes_NestedMessage *this_00;
  UnsetFieldsMetadata **ppUVar4;
  char *in_R9;
  Id IVar5;
  string_view field;
  string_view field_00;
  string_view field_01;
  string_view field_02;
  string_view field_03;
  FieldDescriptor *pFVar6;
  FieldDescriptor *in_stack_fffffffffffff7a8;
  AssertHelper local_738;
  Message local_730;
  basic_string_view<char,_std::char_traits<char>_> local_728;
  Id local_718;
  testing local_708 [8];
  Message *pMStack_700;
  char local_6f8 [16];
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_6b8;
  Message local_6b0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6a8;
  size_t sStack_6a0;
  bool local_689;
  undefined1 local_688 [8];
  AssertionResult gtest_ar__3;
  string_view parse_string_3;
  AssertHelper local_648;
  Message local_640;
  basic_string_view<char,_std::char_traits<char>_> local_638;
  Id local_628;
  testing local_618 [8];
  Message *pMStack_610;
  char local_608 [16];
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_5c8;
  Message local_5c0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  size_t sStack_5b0;
  bool local_599;
  undefined1 local_598 [8];
  AssertionResult gtest_ar__2;
  string_view parse_string_2;
  AssertHelper local_558;
  Message local_550;
  basic_string_view<char,_std::char_traits<char>_> local_548;
  Id local_538;
  testing local_528 [8];
  Message *pMStack_520;
  char local_518 [16];
  undefined1 local_508 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4d8;
  Message local_4d0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  size_t sStack_4c0;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__1;
  string_view parse_string_1;
  AssertHelper local_468;
  Message local_460;
  basic_string_view<char,_std::char_traits<char>_> local_458;
  Id local_448;
  basic_string_view<char,_std::char_traits<char>_> local_438;
  Message *local_428;
  FieldDescriptor *local_420;
  UnorderedElementsAreMatcher<std::tuple<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  local_418;
  char local_3f8 [32];
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3a8;
  Message local_3a0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  size_t sStack_390;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_;
  string_view parse_string;
  undefined1 local_338 [8];
  UnsetFieldsMetadata no_op_fields;
  undefined1 local_308 [8];
  Parser parser;
  TestAllTypes proto;
  TextFormatTest_FieldsPopulatedCorrectly_Test *this_local;
  
  proto3_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&parser.no_op_fields_);
  TextFormat::Parser::Parser((Parser *)local_308);
  TextFormat::Parser::UnsetFieldsMetadata::UnsetFieldsMetadata((UnsetFieldsMetadata *)local_338);
  TextFormat::Parser::OutputNoOpFields((Parser *)local_308,(UnsetFieldsMetadata *)local_338);
  parse_string._M_str = (char *)0x0;
  TextFormat::Parser::UnsetFieldsMetadata::UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&parse_string._M_str);
  TextFormat::Parser::UnsetFieldsMetadata::operator=
            ((UnsetFieldsMetadata *)local_338,(UnsetFieldsMetadata *)&parse_string._M_str);
  TextFormat::Parser::UnsetFieldsMetadata::~UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&parse_string._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "\n      optional_int32: 0\n      optional_uint32: 10\n      optional_nested_message { bb: 0 }\n    "
            );
  local_398.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar_.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  sStack_390 = parse_string._M_len;
  input_02._M_str = (char *)parse_string._M_len;
  input_02._M_len =
       (size_t)gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  ppUVar4 = &parser.no_op_fields_;
  local_379 = TextFormat::Parser::ParseFromString((Parser *)local_308,input_02,(Message *)ppUVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_378,&local_379,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_378,
               (AssertionResult *)"parser.ParseFromString(parse_string, &proto)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ppUVar4 = (UnsetFieldsMetadata **)0x4b4;
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4b4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_438,"optional_int32");
  field._M_str = (char *)ppUVar4;
  field._M_len = (size_t)local_438._M_str;
  IVar5 = internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                    ((UnsetFieldsMetadataTextFormatTestUtil *)&parser.no_op_fields_,
                     (Message *)local_438._M_len,field);
  local_420 = IVar5.second;
  pMVar3 = IVar5.first;
  local_428 = pMVar3;
  this_00 = proto3_unittest::TestAllTypes::optional_nested_message
                      ((TestAllTypes *)&parser.no_op_fields_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_458,"bb");
  field_00._M_str = (char *)pMVar3;
  field_00._M_len = (size_t)local_458._M_str;
  local_448 = internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                        ((UnsetFieldsMetadataTextFormatTestUtil *)this_00,
                         (Message *)local_458._M_len,field_00);
  testing::
  UnorderedElementsAre<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>,std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
            (&local_418,(testing *)&local_428,&local_448,
             (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *)
             local_448.first);
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Tuple_impl<1UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<1UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.second =
       (FieldDescriptor *)
       local_418.matchers_.
       super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
       .
       super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
       ._M_head_impl.first;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Tuple_impl<1UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<1UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.first =
       (Message *)
       local_418.matchers_.
       super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
       .
       super__Tuple_impl<1UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
       .
       super__Head_base<1UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
       ._M_head_impl.second;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.first =
       (Message *)
       local_418.matchers_.
       super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
       .
       super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
       ._M_head_impl.second;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.second = in_stack_fffffffffffff7a8;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>,std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
            (matcher_02);
  internal::UnsetFieldsMetadataTextFormatTestUtil::GetRawIds((UnsetFieldsMetadata *)local_338);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>,std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
  ::operator()(local_3d8,local_3f8,
               (flat_hash_set<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)"Peer::GetRawIds(no_op_fields)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  pFVar6 = (FieldDescriptor *)
           local_418.matchers_.
           super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
           .
           super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
           ._M_head_impl.first;
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4b8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message(&local_460);
    pFVar6 = (FieldDescriptor *)
             local_418.matchers_.
             super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
             .
             super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
             ._M_head_impl.first;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  parse_string_1._M_str = (char *)0x0;
  TextFormat::Parser::UnsetFieldsMetadata::UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&parse_string_1._M_str);
  TextFormat::Parser::UnsetFieldsMetadata::operator=
            ((UnsetFieldsMetadata *)local_338,(UnsetFieldsMetadata *)&parse_string_1._M_str);
  TextFormat::Parser::UnsetFieldsMetadata::~UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&parse_string_1._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,
             "\n      optional_bool: false\n      optional_uint32: 10\n      optional_nested_message { bb: 20 }\n    "
            );
  local_4c8.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar__1.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  sStack_4c0 = parse_string_1._M_len;
  input_01._M_str = (char *)parse_string_1._M_len;
  input_01._M_len =
       (size_t)gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  ppUVar4 = &parser.no_op_fields_;
  local_4a9 = TextFormat::Parser::ParseFromString((Parser *)local_308,input_01,(Message *)ppUVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_4a8,
               (AssertionResult *)"parser.ParseFromString(parse_string, &proto)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ppUVar4 = (UnsetFieldsMetadata **)0x4c1;
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4c1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_548,"optional_bool");
  field_01._M_str = (char *)ppUVar4;
  field_01._M_len = (size_t)local_548._M_str;
  local_538 = internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                        ((UnsetFieldsMetadataTextFormatTestUtil *)&parser.no_op_fields_,
                         (Message *)local_548._M_len,field_01);
  testing::
  UnorderedElementsAre<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
            (local_528,&local_538);
  matcher.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.second = pFVar6;
  matcher.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.first = pMStack_520;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
            (matcher);
  internal::UnsetFieldsMetadataTextFormatTestUtil::GetRawIds((UnsetFieldsMetadata *)local_338);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
  ::operator()(local_508,local_518,
               (flat_hash_set<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)"Peer::GetRawIds(no_op_fields)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4c3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  parse_string_2._M_str = (char *)0x0;
  TextFormat::Parser::UnsetFieldsMetadata::UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&parse_string_2._M_str);
  TextFormat::Parser::UnsetFieldsMetadata::operator=
            ((UnsetFieldsMetadata *)local_338,(UnsetFieldsMetadata *)&parse_string_2._M_str);
  TextFormat::Parser::UnsetFieldsMetadata::~UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&parse_string_2._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__2.message_,
             "optional_string: \"\"");
  local_5b8.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar__2.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  sStack_5b0 = parse_string_2._M_len;
  input_00._M_str = (char *)parse_string_2._M_len;
  input_00._M_len =
       (size_t)gtest_ar__2.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  ppUVar4 = &parser.no_op_fields_;
  local_599 = TextFormat::Parser::ParseFromString((Parser *)local_308,input_00,(Message *)ppUVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_598,&local_599,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_598);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_598,
               (AssertionResult *)"parser.ParseFromString(parse_string, &proto)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ppUVar4 = (UnsetFieldsMetadata **)0x4ca;
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4ca,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_638,"optional_string");
  field_02._M_str = (char *)ppUVar4;
  field_02._M_len = (size_t)local_638._M_str;
  local_628 = internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                        ((UnsetFieldsMetadataTextFormatTestUtil *)&parser.no_op_fields_,
                         (Message *)local_638._M_len,field_02);
  testing::
  UnorderedElementsAre<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
            (local_618,&local_628);
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.second = pFVar6;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.first = pMStack_610;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
            (matcher_00);
  internal::UnsetFieldsMetadataTextFormatTestUtil::GetRawIds((UnsetFieldsMetadata *)local_338);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
  ::operator()(local_5f8,local_608,
               (flat_hash_set<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)"Peer::GetRawIds(no_op_fields)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4cc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  parse_string_3._M_str = (char *)0x0;
  TextFormat::Parser::UnsetFieldsMetadata::UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&parse_string_3._M_str);
  TextFormat::Parser::UnsetFieldsMetadata::operator=
            ((UnsetFieldsMetadata *)local_338,(UnsetFieldsMetadata *)&parse_string_3._M_str);
  TextFormat::Parser::UnsetFieldsMetadata::~UnsetFieldsMetadata
            ((UnsetFieldsMetadata *)&parse_string_3._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__3.message_,
             "optional_bytes: \"\"");
  local_6a8.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar__3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  sStack_6a0 = parse_string_3._M_len;
  input._M_str = (char *)parse_string_3._M_len;
  input._M_len = (size_t)gtest_ar__3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
  ppUVar4 = &parser.no_op_fields_;
  local_689 = TextFormat::Parser::ParseFromString((Parser *)local_308,input,(Message *)ppUVar4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_688,&local_689,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_688,
               (AssertionResult *)"parser.ParseFromString(parse_string, &proto)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ppUVar4 = (UnsetFieldsMetadata **)0x4d3;
    testing::internal::AssertHelper::AssertHelper
              (&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4d3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b8);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_728,"optional_bytes");
  field_03._M_str = (char *)ppUVar4;
  field_03._M_len = (size_t)local_728._M_str;
  local_718 = internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                        ((UnsetFieldsMetadataTextFormatTestUtil *)&parser.no_op_fields_,
                         (Message *)local_728._M_len,field_03);
  testing::
  UnorderedElementsAre<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
            (local_708,&local_718);
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.second = pFVar6;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
  .
  super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_false>
  ._M_head_impl.first = pMStack_700;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
            (matcher_01);
  internal::UnsetFieldsMetadataTextFormatTestUtil::GetRawIds((UnsetFieldsMetadata *)local_338);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
  ::operator()(local_6e8,local_6f8,
               (flat_hash_set<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)"Peer::GetRawIds(no_op_fields)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4d5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_738,&local_730);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
  TextFormat::Parser::UnsetFieldsMetadata::~UnsetFieldsMetadata((UnsetFieldsMetadata *)local_338);
  TextFormat::Parser::~Parser((Parser *)local_308);
  proto3_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&parser.no_op_fields_);
  return;
}

Assistant:

TEST_F(TextFormatTest, FieldsPopulatedCorrectly) {
  using Peer = UnsetFieldsMetadataTextFormatTestUtil;
  proto3_unittest::TestAllTypes proto;
  TextFormat::Parser parser;
  TextFormat::Parser::UnsetFieldsMetadata no_op_fields;
  parser.OutputNoOpFields(&no_op_fields);
  {
    no_op_fields = {};
    const absl::string_view parse_string = R"pb(
      optional_int32: 0
      optional_uint32: 10
      optional_nested_message { bb: 0 }
    )pb";
    EXPECT_TRUE(parser.ParseFromString(parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(
                    Peer::GetId(proto, "optional_int32"),
                    Peer::GetId(proto.optional_nested_message(), "bb")));
  }
  {
    no_op_fields = {};
    const absl::string_view parse_string = R"pb(
      optional_bool: false
      optional_uint32: 10
      optional_nested_message { bb: 20 }
    )pb";
    EXPECT_TRUE(parser.ParseFromString(parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_bool")));
  }
  {
    // The address returned by the field is a string_view, which is a separate
    // allocation. Check address directly.
    no_op_fields = {};
    const absl::string_view parse_string = "optional_string: \"\"";
    EXPECT_TRUE(parser.ParseFromString(parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_string")));
  }
  {
    // The address returned by the field is a string_view, which is a separate
    // allocation. Check address directly.
    no_op_fields = {};
    const absl::string_view parse_string = "optional_bytes: \"\"";
    EXPECT_TRUE(parser.ParseFromString(parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_bytes")));
  }
}